

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsPrimitive<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (SizedDeclarationsPrimitive<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  bool bVar1;
  pointer ppVar2;
  TestError *pTVar3;
  undefined1 *local_160;
  string *fs;
  string *gs;
  string *tes;
  string *tcs;
  string *vs;
  string *cs;
  size_t remaining_sub_script_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  allocator<char> local_c1;
  undefined1 local_c0 [8];
  string shader_source;
  size_t base_sub_script_index;
  undefined1 local_88 [8];
  string base_variable_string;
  string base_var_type;
  size_t max_dimension_limit;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_38;
  iterator local_30;
  _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_> local_28;
  _supported_variable_types_map_const_iterator var_iterator;
  size_t var_type_index;
  TestShaderType tested_shader_type_local;
  SizedDeclarationsPrimitive<glcts::ArraysOfArrays::Interface::ES> *this_local;
  
  var_iterator._M_node = (_Base_ptr)0x0;
  while( true ) {
    if ((_Base_ptr)0x1b < var_iterator._M_node) {
      return;
    }
    local_30._M_node =
         (_Base_ptr)
         std::
         map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
         ::find((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                 *)supported_variable_types_map,
                (key_type *)(Interface::ES::var_types + (long)var_iterator._M_node * 4));
    std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>::
    _Rb_tree_const_iterator(&local_28,&local_30);
    max_dimension_limit =
         (size_t)std::
                 map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                 ::end((map<glcts::test_var_type,_glcts::var_descriptor,_std::less<glcts::test_var_type>,_std::allocator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>_>
                        *)supported_variable_types_map);
    std::_Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>::
    _Rb_tree_const_iterator(&local_38,(iterator *)&max_dimension_limit);
    bVar1 = std::operator!=(&local_28,&local_38);
    if (!bVar1) break;
    for (base_var_type.field_2._8_8_ = 2; (ulong)base_var_type.field_2._8_8_ < 9;
        base_var_type.field_2._8_8_ = base_var_type.field_2._8_8_ + 1) {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_glcts::test_var_type,_glcts::var_descriptor>_>
               ::operator->(&local_28);
      std::__cxx11::string::string
                ((string *)(base_variable_string.field_2._M_local_buf + 8),(string *)&ppVar2->second
                );
      std::__cxx11::string::string
                ((string *)local_88,(string *)(base_variable_string.field_2._M_local_buf + 8));
      for (shader_source.field_2._8_8_ = 0;
          (ulong)shader_source.field_2._8_8_ <= (ulong)base_var_type.field_2._8_8_;
          shader_source.field_2._8_8_ = shader_source.field_2._8_8_ + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_c0,"",&local_c1);
        std::allocator<char>::~allocator(&local_c1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &remaining_sub_script_index,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       shader_start_abi_cxx11_,"    ");
        std::operator+(&local_108,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &remaining_sub_script_index,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88
                      );
        std::operator+(&local_e8,&local_108," a");
        std::__cxx11::string::operator+=((string *)local_c0,(string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::~string((string *)&remaining_sub_script_index);
        for (cs = (string *)shader_source.field_2._8_8_; cs < (ulong)base_var_type.field_2._8_8_;
            cs = (string *)&cs->field_0x1) {
          std::__cxx11::string::operator+=((string *)local_c0,"[2]");
        }
        std::__cxx11::string::operator+=((string *)local_c0,";\n");
        switch(tested_shader_type) {
        case FRAGMENT_SHADER_TYPE:
          break;
        case VERTEX_SHADER_TYPE:
          std::__cxx11::string::operator+=((string *)local_c0,"\n\tgl_Position = vec4(0.0);\n");
          break;
        case COMPUTE_SHADER_TYPE:
          break;
        case GEOMETRY_SHADER_TYPE:
          std::__cxx11::string::operator+=((string *)local_c0,(string *)emit_quad_abi_cxx11_);
          break;
        case TESSELATION_CONTROL_SHADER_TYPE:
          std::__cxx11::string::operator+=((string *)local_c0,(string *)set_tesseation_abi_cxx11_);
          break;
        case TESSELATION_EVALUATION_SHADER_TYPE:
          break;
        default:
          pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar3,"Unrecognized shader type.",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                     ,0x51d);
          __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        std::__cxx11::string::operator+=((string *)local_c0,(string *)shader_end_abi_cxx11_);
        tcs = (string *)default_vertex_shader_source_abi_cxx11_;
        local_160 = default_fragment_shader_source_abi_cxx11_;
        switch(tested_shader_type) {
        case FRAGMENT_SHADER_TYPE:
          local_160 = local_c0;
          break;
        case VERTEX_SHADER_TYPE:
          tcs = (string *)local_c0;
          break;
        case COMPUTE_SHADER_TYPE:
          tcs = (string *)empty_string_abi_cxx11_;
          local_160 = empty_string_abi_cxx11_;
          break;
        case GEOMETRY_SHADER_TYPE:
          break;
        case TESSELATION_CONTROL_SHADER_TYPE:
          break;
        case TESSELATION_EVALUATION_SHADER_TYPE:
          break;
        default:
          pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar3,"Invalid enum",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                     ,0x520);
          __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
          super_TestNode._vptr_TestNode[9])(this,tcs,local_160,1,0);
        std::__cxx11::string::operator+=((string *)local_88,"[2]");
        std::__cxx11::string::~string((string *)local_c0);
      }
      std::__cxx11::string::~string((string *)local_88);
      std::__cxx11::string::~string((string *)(base_variable_string.field_2._M_local_buf + 8));
    }
    var_iterator._M_node = (_Base_ptr)((long)&(var_iterator._M_node)->_M_color + 1);
  }
  pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar3,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x529);
  __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void SizedDeclarationsPrimitive<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	for (size_t var_type_index = 0; var_type_index < API::n_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(API::var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			/* Loop round for each var_types ("int", "uint", "float", etc.)
			 * We are testing a[][] to a [][][][][][][][], so start counter at 2. */
			for (size_t max_dimension_limit = 2; max_dimension_limit <= API::MAX_ARRAY_DIMENSIONS;
				 max_dimension_limit++)
			{
				// Record the base varTypeModifier + varType
				std::string base_var_type		 = var_iterator->second.type;
				std::string base_variable_string = base_var_type;

				for (size_t base_sub_script_index = 0; base_sub_script_index <= max_dimension_limit;
					 base_sub_script_index++)
				{
					std::string shader_source = "";

					// Add the shader body start, and the base varTypeModifier + varType + variable name.
					shader_source += shader_start + "    " + base_variable_string + " a";

					for (size_t remaining_sub_script_index = base_sub_script_index;
						 remaining_sub_script_index < max_dimension_limit; remaining_sub_script_index++)
					{
						/* Add as many array sub_scripts as we can, up to the current dimension limit. */
						shader_source += "[2]";
					}

					/* End line */
					shader_source += ";\n";

					/* End main */
					DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

					/* Execute test */
					EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);

					/* From now on, we'll have an extra sub_script each time. */
					base_variable_string += "[2]";
				} /* for (int base_sub_script_index = 0; ...) */
			}	 /* for (int max_dimension_limit = 2; ...) */
		}		  /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}